

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::RewindLoopFixedGroupLastIterationCont::Exec
          (RewindLoopFixedGroupLastIterationCont *this,Matcher *matcher,Char *input,
          CharCount *inputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks)

{
  int iVar1;
  GroupInfo *pGVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  CharCount CVar6;
  undefined4 *puVar7;
  Program *pPVar8;
  Type TVar9;
  LoopInfo *pLVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  Matcher::QueryContinue(matcher,qcTicks);
  uVar13 = (ulong)*(uint *)&(this->super_Cont).field_0xc;
  pPVar8 = (matcher->program).ptr;
  if ((ulong)(pPVar8->rep).insts.instsLen < uVar13 + 0x1c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar4) goto LAB_00ef266c;
    *puVar7 = 0;
    pPVar8 = (matcher->program).ptr;
  }
  lVar11 = *(long *)&pPVar8->rep;
  if (*(char *)(lVar11 + uVar13) != 'N') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar4) goto LAB_00ef266c;
    *puVar7 = 0;
    pPVar8 = (matcher->program).ptr;
    lVar11 = *(long *)&pPVar8->rep;
  }
  iVar1 = *(int *)(lVar11 + 1 + uVar13);
  if (((long)iVar1 < 0) || (pPVar8->numLoops <= iVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar4) goto LAB_00ef266c;
    *puVar7 = 0;
  }
  pLVar10 = (matcher->loopInfos).ptr + iVar1;
  uVar5 = *(uint *)(lVar11 + 0x17 + uVar13);
  lVar12 = (long)(int)uVar5;
  if ((lVar12 < 0) || (((matcher->program).ptr)->numGroups <= uVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar4) goto LAB_00ef266c;
    *puVar7 = 0;
  }
  pGVar2 = (matcher->groupInfos).ptr;
  if (this->tryingBody == true) {
    this->tryingBody = false;
    uVar5 = pLVar10->number;
    if (uVar5 < *(uint *)(lVar11 + 5 + uVar13)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x12ee,"(loopInfo->number >= begin->repeats.lower)",
                         "loopInfo->number >= begin->repeats.lower");
      if (!bVar4) goto LAB_00ef266c;
      *puVar7 = 0;
      uVar5 = pLVar10->number;
    }
  }
  else {
    uVar5 = pLVar10->number;
    if (uVar5 <= *(uint *)(lVar11 + 5 + uVar13)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x12f3,"(loopInfo->number > begin->repeats.lower)",
                         "loopInfo->number > begin->repeats.lower");
      if (!bVar4) goto LAB_00ef266c;
      *puVar7 = 0;
      uVar5 = pLVar10->number;
    }
    uVar5 = uVar5 - 1;
    pLVar10->number = uVar5;
  }
  CVar6 = uVar5 * *(int *)(lVar11 + 0x13 + uVar13) + pLVar10->startInputOffset;
  *inputOffset = CVar6;
  uVar5 = pLVar10->number;
  if (uVar5 == 0) {
    TVar9 = 0xffffffff;
  }
  else {
    TVar9 = *(Type *)(lVar11 + 0x13 + uVar13);
    pGVar2[lVar12].offset = CVar6 - TVar9;
  }
  pGVar2[lVar12].length = TVar9;
  if (*(uint *)(lVar11 + 5 + uVar13) < uVar5) {
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
    UnPop<UnifiedRegex::RewindLoopFixedGroupLastIterationCont>
              (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    Matcher::UnPopStats(matcher,contStack,input);
  }
  uVar5 = *(uint *)(lVar11 + 0xf + uVar13);
  pPVar8 = (matcher->program).ptr;
  if ((pPVar8->rep).insts.instsLen <= uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x76d,"(label < program->rep.insts.instsLen)",
                       "label < program->rep.insts.instsLen");
    if (!bVar4) {
LAB_00ef266c:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
    pPVar8 = (matcher->program).ptr;
  }
  *instPointer = (pPVar8->rep).insts.insts.ptr + uVar5;
  return true;
}

Assistant:

inline bool RewindLoopFixedGroupLastIterationCont::Exec(REGEX_CONT_EXEC_PARAMETERS)
    {
        matcher.QueryContinue(qcTicks);

        BeginLoopFixedGroupLastIterationInst* begin = matcher.L2I(BeginLoopFixedGroupLastIteration, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);
        GroupInfo* groupInfo = matcher.GroupIdToGroupInfo(begin->groupId);

        if (tryingBody)
        {
            tryingBody = false;
            // loopInfo->number is the number of iterations completed before current attempt of body
            Assert(loopInfo->number >= begin->repeats.lower);
        }
        else
        {
            // loopInfo->number is the number of iterations completed before trying follow
            Assert(loopInfo->number > begin->repeats.lower);
            // Try follow with one fewer iteration
            loopInfo->number--;
        }

        // Rewind input
        inputOffset = loopInfo->startInputOffset + loopInfo->number * begin->length;

        if (loopInfo->number > 0)
        {
            // Bind previous iteration's body
            groupInfo->offset = inputOffset - begin->length;
            groupInfo->length = begin->length;
        }
        else
        {
            groupInfo->Reset();
        }

        if (loopInfo->number > begin->repeats.lower)
        {
            // Un-pop the continuation ready for next time
            contStack.UnPop<RewindLoopFixedGroupLastIterationCont>();
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.UnPopStats(contStack, input);
#endif
        }
        // else: Can't try any fewer iterations if follow fails, so leave continuation as popped and let failure propagate

        instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        return true; // STOP BACKTRACKING
    }